

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::SetDomain(ON_PolyCurve *this,double t0,double t1)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  double s;
  int local_48;
  int count;
  int i;
  bool rc;
  ON_Interval d1;
  ON_Interval d0;
  double t1_local;
  double t0_local;
  ON_PolyCurve *this_local;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  ON_Interval::ON_Interval((ON_Interval *)&i,t0,t1);
  bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&i);
  if ((bVar1) &&
     (bVar2 = ON_Interval::operator!=((ON_Interval *)(d1.m_t + 1),(ON_Interval *)&i), bVar2)) {
    iVar3 = ON_SimpleArray<double>::Count(&this->m_t);
    for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
      pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_48);
      dVar5 = ON_Interval::NormalizedParameterAt((ON_Interval *)(d1.m_t + 1),*pdVar4);
      dVar5 = ON_Interval::ParameterAt((ON_Interval *)&i,dVar5);
      pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_48);
      *pdVar4 = dVar5;
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  }
  return bVar1;
}

Assistant:

bool ON_PolyCurve::SetDomain( double t0, double t1 )
{
  ON_Interval d0 = Domain();
  ON_Interval d1(t0,t1);
  bool rc = d1.IsIncreasing();
  if ( rc && d0 != d1 )
  {
    int i, count = m_t.Count();
    double s;
    for ( i = 0; i < count; i++ )
    {
      s = d0.NormalizedParameterAt( m_t[i] );
      m_t[i] = d1.ParameterAt( s );
    }
  	DestroyRuntimeCache();
  }
  return rc;
}